

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_io_write(jit_State *J,RecordFFData *rd)

{
  RecordFFData *pRVar1;
  undefined2 uVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  ushort *puVar9;
  ptrdiff_t pVar10;
  uint local_a4;
  TRef tr_1;
  TRef tr;
  IRIns *irs;
  TRef len;
  TRef buf;
  TRef str;
  ptrdiff_t i;
  TRef one;
  TRef zero;
  TRef fp;
  TRef ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  RecordFFData *local_50;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  RecordFFData *local_40;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  RecordFFData *local_30;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  RecordFFData *local_20;
  undefined2 local_16;
  undefined2 local_14;
  undefined2 local_12;
  RecordFFData *local_10;
  
  _fp = rd;
  rd_local = (RecordFFData *)J;
  TVar3 = recff_io_fp(J,&zero,rd->data);
  TVar4 = lj_ir_kint((jit_State *)rd_local,0);
  TVar5 = lj_ir_kint((jit_State *)rd_local,1);
  for (_buf = (long)(int)(uint)(_fp->data == 0);
      *(int *)(*(long *)&rd_local[6].data + _buf * 4) != 0; _buf = _buf + 1) {
    TVar6 = lj_ir_tostr((jit_State *)rd_local,*(TRef *)(*(long *)&rd_local[6].data + _buf * 4));
    uVar2 = (undefined2)TVar6;
    local_10 = rd_local;
    local_12 = 0x4009;
    local_16 = (undefined2)TVar4;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x4009;
    *(undefined2 *)&rd_local[7].data = uVar2;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_16;
    local_14 = uVar2;
    TVar7 = lj_opt_fold((jit_State *)rd_local);
    local_20 = rd_local;
    local_22 = 0x4513;
    local_26 = 0;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x4513;
    *(undefined2 *)&rd_local[7].data = uVar2;
    *(undefined2 *)((long)&rd_local[7].data + 2) = 0;
    local_24 = uVar2;
    TVar8 = lj_opt_fold((jit_State *)rd_local);
    if (((TVar8 & 0xffff) < 0x8000) &&
       (*(int *)(rd_local[1].nres + (ulong)(TVar8 & 0xffff) * 8) == 1)) {
      puVar9 = (ushort *)(rd_local[1].nres + (ulong)(TVar6 & 0xffff) * 8);
      if ((*(char *)((long)puVar9 + 5) == ']') && (puVar9[1] == 2)) {
        local_a4 = (uint)*puVar9;
      }
      else {
        local_30 = rd_local;
        local_32 = 0x4610;
        local_34 = (undefined2)TVar7;
        local_36 = 1;
        *(undefined2 *)&rd_local[7].field_0x14 = 0x4610;
        *(undefined2 *)&rd_local[7].data = local_34;
        *(undefined2 *)((long)&rd_local[7].data + 2) = 1;
        local_a4 = lj_opt_fold((jit_State *)rd_local);
      }
      TVar6 = lj_ir_call((jit_State *)rd_local,IRCALL_fputc,(ulong)local_a4,(ulong)TVar3);
      pVar10 = results_wanted((jit_State *)rd_local);
      pRVar1 = rd_local;
      if (pVar10 != 0) {
        TVar7 = lj_ir_kint((jit_State *)rd_local,-1);
        local_40 = pRVar1;
        local_42 = 0x993;
        local_46 = (undefined2)TVar7;
        *(undefined2 *)&pRVar1[7].field_0x14 = 0x993;
        *(short *)&pRVar1[7].data = (short)TVar6;
        *(undefined2 *)((long)&pRVar1[7].data + 2) = local_46;
        local_44 = (short)TVar6;
        lj_opt_fold((jit_State *)rd_local);
      }
    }
    else {
      TVar6 = lj_ir_call((jit_State *)rd_local,IRCALL_fwrite,(ulong)TVar7,(ulong)TVar5,(ulong)TVar8,
                         (ulong)TVar3);
      pVar10 = results_wanted((jit_State *)rd_local);
      if (pVar10 != 0) {
        J_local._4_2_ = (undefined2)TVar6;
        local_50 = rd_local;
        J_local._6_2_ = 0x893;
        J_local._2_2_ = (undefined2)TVar8;
        *(undefined2 *)&rd_local[7].field_0x14 = 0x893;
        *(undefined2 *)&rd_local[7].data = J_local._4_2_;
        *(undefined2 *)((long)&rd_local[7].data + 2) = J_local._2_2_;
        lj_opt_fold((jit_State *)rd_local);
      }
    }
  }
  **(undefined4 **)&rd_local[6].data = 0x2007ffd;
  return;
}

Assistant:

static void LJ_FASTCALL recff_io_write(jit_State *J, RecordFFData *rd)
{
  TRef ud, fp = recff_io_fp(J, &ud, rd->data);
  TRef zero = lj_ir_kint(J, 0);
  TRef one = lj_ir_kint(J, 1);
  ptrdiff_t i = rd->data == 0 ? 1 : 0;
  for (; J->base[i]; i++) {
    TRef str = lj_ir_tostr(J, J->base[i]);
    TRef buf = emitir(IRT(IR_STRREF, IRT_PGC), str, zero);
    TRef len = emitir(IRTI(IR_FLOAD), str, IRFL_STR_LEN);
    if (tref_isk(len) && IR(tref_ref(len))->i == 1) {
      IRIns *irs = IR(tref_ref(str));
      TRef tr = (irs->o == IR_TOSTR && irs->op2 == IRTOSTR_CHAR) ?
		irs->op1 :
		emitir(IRT(IR_XLOAD, IRT_U8), buf, IRXLOAD_READONLY);
      tr = lj_ir_call(J, IRCALL_fputc, tr, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_NE), tr, lj_ir_kint(J, -1));
    } else {
      TRef tr = lj_ir_call(J, IRCALL_fwrite, buf, one, len, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_EQ), tr, len);
    }
  }
  J->base[0] = LJ_52 ? ud : TREF_TRUE;
}